

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglImageFormatTests.cpp
# Opt level: O2

void __thiscall
deqp::egl::Image::ModifyTests::ModifyTests
          (ModifyTests *this,EglTestContext *eglTestCtx,string *name,string *desc)

{
  ImageTests::ImageTests(&this->super_ImageTests,eglTestCtx,name,desc);
  (this->super_ImageTests).super_TestCaseGroup.super_TestCaseGroup.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ModifyTests_003de3b0;
  LabeledActions::LabeledActions(&this->m_modifyActions);
  (this->m_renderAction).super_Render.super_GLES2Action.super_Action._vptr_Action =
       (_func_int **)&PTR__Action_003de2c0;
  return;
}

Assistant:

ModifyTests		(EglTestContext& eglTestCtx, const string& name, const string& desc)
									: ImageTests(eglTestCtx, name, desc) {}